

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

void __thiscall
ncnn::ConvolutionDepthWise_x86::~ConvolutionDepthWise_x86(ConvolutionDepthWise_x86 *this)

{
  pointer ppLVar1;
  pointer ppLVar2;
  int i;
  long lVar3;
  
  (this->super_ConvolutionDepthWise).super_Layer._vptr_Layer =
       (_func_int **)&PTR__ConvolutionDepthWise_x86_0013a520;
  lVar3 = 0;
  while( true ) {
    ppLVar1 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar2 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar2 - (long)ppLVar1) >> 3) <= lVar3) break;
    if (ppLVar1[lVar3] != (Layer *)0x0) {
      (*ppLVar1[lVar3]->_vptr_Layer[1])();
    }
    lVar3 = lVar3 + 1;
  }
  if (ppLVar2 != ppLVar1) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar1;
  }
  std::_Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::~_Vector_base
            (&(this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>);
  ConvolutionDepthWise::~ConvolutionDepthWise(&this->super_ConvolutionDepthWise);
  return;
}

Assistant:

ConvolutionDepthWise_x86::~ConvolutionDepthWise_x86()
{
    for (int i=0; i<(int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();
}